

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_purge(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  OBJ_DATA *pOVar2;
  DESCRIPTOR_DATA *dclose;
  OBJ_DATA *obj;
  bool bVar3;
  int iVar4;
  int iVar5;
  CHAR_DATA *pCVar6;
  ROOM_INDEX_DATA *pRVar7;
  char *txt;
  char buf [100];
  char arg [4608];
  char acStack_1298 [112];
  char local_1228 [4616];
  
  txt = acStack_1298;
  one_argument(argument,local_1228);
  if (local_1228[0] == '\0') {
    pRVar7 = ch->in_room;
    pCVar6 = pRVar7->people;
    if (pRVar7->people != (CHAR_DATA *)0x0) {
      do {
        pCVar1 = pCVar6->next_in_room;
        bVar3 = is_npc(pCVar6);
        if (((bVar3) && (pCVar6 != ch)) && ((pCVar6->act[0] & 0x200000U) == 0)) {
          extract_char(pCVar6,true);
        }
        pCVar6 = pCVar1;
      } while (pCVar1 != (CHAR_DATA *)0x0);
      pRVar7 = ch->in_room;
    }
    pOVar2 = pRVar7->contents;
    while (obj = pOVar2, obj != (OBJ_DATA *)0x0) {
      pOVar2 = obj->next_content;
      bVar3 = is_obj_stat(obj,0xe);
      if (!bVar3) {
        extract_obj(obj);
      }
    }
    act("$n purges the room!",ch,(void *)0x0,(void *)0x0,0);
    txt = "Ok.\n\r";
  }
  else {
    pCVar6 = get_char_world(ch,local_1228);
    if (pCVar6 == (CHAR_DATA *)0x0) {
      txt = "They aren\'t here.\n\r";
    }
    else {
      bVar3 = is_npc(pCVar6);
      if (bVar3) {
        act("$n purges $N.",ch,(void *)0x0,pCVar6,1);
        extract_char(pCVar6,true);
        return;
      }
      if (pCVar6 == ch) {
        txt = "Ho ho ho.\n\r";
      }
      else {
        iVar4 = get_trust(ch);
        iVar5 = get_trust(pCVar6);
        if (iVar5 < iVar4) {
          act("$n disintegrates $N!",ch,(void *)0x0,pCVar6,1);
          if (1 < pCVar6->level) {
            save_char_obj(pCVar6);
          }
          dclose = pCVar6->desc;
          extract_char(pCVar6,true);
          if (dclose == (DESCRIPTOR_DATA *)0x0) {
            return;
          }
          close_socket(dclose);
          return;
        }
        send_to_char("Maybe that wasn\'t a good idea...\n\r",ch);
        sprintf(acStack_1298,"%s tried to purge you!\n\r",ch->name);
        ch = pCVar6;
      }
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_purge(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char buf[100];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	DESCRIPTOR_DATA *d;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		/* 'purge' */
		CHAR_DATA *vnext;
		OBJ_DATA *obj_next;

		for (victim = ch->in_room->people; victim != nullptr; victim = vnext)
		{
			vnext = victim->next_in_room;

			if (is_npc(victim) && !IS_SET(victim->act, ACT_NOPURGE) && victim != ch /* safety precaution */)
				extract_char(victim, true);
		}

		for (obj = ch->in_room->contents; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;

			if (!is_obj_stat(obj, ITEM_NOPURGE))
				extract_obj(obj);
		}

		act("$n purges the room!", ch, nullptr, nullptr, TO_ROOM);
		send_to_char("Ok.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (!is_npc(victim))
	{
		if (ch == victim)
		{
			send_to_char("Ho ho ho.\n\r", ch);
			return;
		}

		if (get_trust(ch) <= get_trust(victim))
		{
			send_to_char("Maybe that wasn't a good idea...\n\r", ch);
			sprintf(buf, "%s tried to purge you!\n\r", ch->name);
			send_to_char(buf, victim);
			return;
		}

		act("$n disintegrates $N!", ch, 0, victim, TO_NOTVICT);

		if (victim->level > 1)
			save_char_obj(victim);

		d = victim->desc;
		extract_char(victim, true);

		if (d != nullptr)
			close_socket(d);

		return;
	}

	act("$n purges $N.", ch, nullptr, victim, TO_NOTVICT);
	extract_char(victim, true);
}